

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O2

void __thiscall serialization::xml_iarchive::load(xml_iarchive *this,string *v)

{
  std::__cxx11::string::assign((char *)v);
  return;
}

Assistant:

void load(std::string & v) const
    {
        v = stack_.top()->value();
    }